

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
* capnp::compiler::NodeTranslator::compileDecl
            (Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
             *__return_storage_ptr__,uint64_t scopeId,uint scopeParameterCount,Resolver *resolver,
            ErrorReporter *errorReporter,Reader expression,Builder brandBuilder)

{
  int *this;
  Reader RVar1;
  ImplicitParams implicitMethodParams;
  BrandScope *pBVar2;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *other;
  BrandedDecl *pBVar3;
  uint64_t scopeId_00;
  ResolveResult local_288;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  SegmentReader *local_1e8;
  CapTableReader *pCStack_1e0;
  void *local_1d8;
  WirePointer *pWStack_1d0;
  undefined8 local_1c8;
  int iStack_1c0;
  undefined4 uStack_1bc;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_1a0;
  undefined1 local_f0 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> decl;
  Own<capnp::compiler::NodeTranslator::BrandScope> scope;
  ErrorReporter *errorReporter_local;
  Resolver *resolver_local;
  uint64_t uStack_18;
  uint scopeParameterCount_local;
  uint64_t scopeId_local;
  
  RVar1._reader = expression._reader;
  this = &decl.field_1.value.source._reader.nestingLimit;
  resolver_local._4_4_ = scopeParameterCount;
  uStack_18 = scopeId;
  scopeId_local = (uint64_t)__return_storage_ptr__;
  kj::
  refcounted<capnp::compiler::NodeTranslator::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&,unsigned_int&,capnp::compiler::NodeTranslator::Resolver&>
            ((kj *)this,errorReporter,&stack0xffffffffffffffe8,(uint *)((long)&resolver_local + 4),
             resolver);
  pBVar2 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator->
                     ((Own<capnp::compiler::NodeTranslator::BrandScope> *)this);
  local_1e8 = expression._reader.segment;
  pCStack_1e0 = expression._reader.capTable;
  local_1d8 = expression._reader.data;
  pWStack_1d0 = expression._reader.pointers;
  local_1c8._0_4_ = expression._reader.dataSize;
  local_1c8._4_2_ = expression._reader.pointerCount;
  local_1c8._6_2_ = expression._reader._38_2_;
  expression._reader._40_8_ = RVar1._reader._40_8_;
  iStack_1c0 = expression._reader.nestingLimit;
  uStack_1bc = expression._reader._44_4_;
  noImplicitParams();
  RVar1._reader.capTable = pCStack_1e0;
  RVar1._reader.segment = local_1e8;
  RVar1._reader.data = local_1d8;
  RVar1._reader.pointers = pWStack_1d0;
  RVar1._reader.dataSize = (StructDataBitCount)local_1c8;
  RVar1._reader.pointerCount = local_1c8._4_2_;
  RVar1._reader._38_2_ = local_1c8._6_2_;
  RVar1._reader.nestingLimit = iStack_1c0;
  RVar1._reader._44_4_ = uStack_1bc;
  implicitMethodParams.params.reader.segment = (SegmentReader *)uStack_218;
  implicitMethodParams.scopeId = local_220;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)local_210;
  implicitMethodParams.params.reader.ptr = (byte *)uStack_208;
  implicitMethodParams.params.reader.elementCount = (undefined4)local_200;
  implicitMethodParams.params.reader.step = local_200._4_4_;
  implicitMethodParams.params.reader.structDataSize = (undefined4)uStack_1f8;
  implicitMethodParams.params.reader.structPointerCount = uStack_1f8._4_2_;
  implicitMethodParams.params.reader.elementSize = uStack_1f8._6_1_;
  implicitMethodParams.params.reader._39_1_ = uStack_1f8._7_1_;
  implicitMethodParams.params.reader._40_8_ = local_1f0;
  BrandScope::compileDeclExpression(&local_1a0,pBVar2,RVar1,resolver,implicitMethodParams);
  other = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_1a0);
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_f0,other);
  kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_1a0);
  pBVar3 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_f0);
  if (pBVar3 == (BrandedDecl *)0x0) {
    kj::
    Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  else {
    pBVar3 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator->
                       ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_f0);
    pBVar2 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator->
                       ((Own<capnp::compiler::NodeTranslator::BrandScope> *)
                        &decl.field_1.value.source._reader.nestingLimit);
    scopeId_00 = BrandScope::getScopeId(pBVar2);
    BrandedDecl::asResolveResult(&local_288,pBVar3,scopeId_00,brandBuilder);
    kj::
    Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::Maybe(__return_storage_ptr__,&local_288);
    kj::
    OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
    ::~OneOf(&local_288);
  }
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_f0);
  kj::Own<capnp::compiler::NodeTranslator::BrandScope>::~Own
            ((Own<capnp::compiler::NodeTranslator::BrandScope> *)
             &decl.field_1.value.source._reader.nestingLimit);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolveResult> NodeTranslator::compileDecl(
    uint64_t scopeId, uint scopeParameterCount, Resolver& resolver, ErrorReporter& errorReporter,
    Expression::Reader expression, schema::Brand::Builder brandBuilder) {
  auto scope = kj::refcounted<BrandScope>(errorReporter, scopeId, scopeParameterCount, resolver);
  KJ_IF_MAYBE(decl, scope->compileDeclExpression(expression, resolver, noImplicitParams())) {
    return decl->asResolveResult(scope->getScopeId(), brandBuilder);
  } else {
    return nullptr;
  }
}